

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_check_files.cpp
# Opt level: O3

map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* read_test_file(map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *__return_storage_ptr__,string *file_name)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  istream *piVar3;
  mapped_type *pmVar4;
  ulong *puVar5;
  string rnum;
  uint32_t val;
  ifstream ifs;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230 [4];
  byte abStack_210 [488];
  
  std::ifstream::ifstream(local_230,(string *)file_name,_S_in);
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) != 0) {
    std::operator+(&local_250,"\'",file_name);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_250);
    puVar5 = (ulong *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_270.field_2._M_allocated_capacity = *puVar5;
      local_270.field_2._8_8_ = plVar2[3];
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    }
    else {
      local_270.field_2._M_allocated_capacity = *puVar5;
      local_270._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_270._M_string_length = plVar2[1];
    *plVar2 = (long)puVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    error(&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_250._M_dataplus._M_p._4_4_,local_250._M_dataplus._M_p._0_4_) !=
        &local_250.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_250._M_dataplus._M_p._4_4_,local_250._M_dataplus._M_p._0_4_),
                      local_250.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_250._M_dataplus._M_p._0_4_ = 0;
  local_270._M_string_length = 0;
  local_270.field_2._M_allocated_capacity =
       local_270.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  while( true ) {
    piVar3 = std::operator>>((istream *)local_230,(string *)&local_270);
    piVar3 = std::istream::_M_extract<unsigned_int>((uint *)piVar3);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    pmVar4 = std::
             map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](__return_storage_ptr__,(key_type *)&local_250);
    std::__cxx11::string::_M_assign((string *)pmVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_230);
  return __return_storage_ptr__;
}

Assistant:

std::map<uint32_t, std::string> read_test_file(const std::string& file_name)
{
	std::ifstream ifs{ file_name };
	if (!ifs)
	{
		error("'" + file_name + "' could not be opened for reading.");
	}
	std::map<uint32_t, std::string> roman_nums;
	uint32_t val{ 0 };
	std::string rnum;
	while (ifs >> rnum >> val)
	{
		roman_nums[val] = rnum;
	}
	return roman_nums;
}